

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::GyroscopeSensor::GyroscopeSensor(GyroscopeSensor *this,GyroscopeSensor *other)

{
  void *pvVar1;
  GyroscopePrivateAttributes *in_RSI;
  undefined8 *in_RDI;
  LinkSensor *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  GyroscopePrivateAttributes *in_stack_ffffffffffffffe8;
  
  LinkSensor::LinkSensor(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__GyroscopeSensor_004fa9d8;
  puVar2 = in_RDI + 1;
  pvVar1 = operator_new(0xa8);
  GyroscopePrivateAttributes::GyroscopePrivateAttributes(in_RSI,in_stack_ffffffffffffffe8);
  *puVar2 = pvVar1;
  return;
}

Assistant:

GyroscopeSensor::GyroscopeSensor(const GyroscopeSensor& other):
    pimpl(new GyroscopePrivateAttributes(*(other.pimpl)))
{

}